

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandCleanup(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint fVerbose;
  char *pcVar5;
  uint fCleanupPis;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  fCleanupPis = 1;
  bVar1 = true;
  fVerbose = 1;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"iovh"), iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == -1) break;
    if (iVar2 == 0x6f) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else {
      if (iVar2 != 0x69) {
        iVar2 = -2;
        Abc_Print(-2,"usage: cleanup [-iovh]\n");
        Abc_Print(-2,"\t        for logic networks, removes dangling combinatinal logic\n");
        Abc_Print(-2,"\t        for AIGs, removes PIs w/o fanout and POs driven by const-0\n");
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (fCleanupPis == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-i    : toggles removing PIs without fanout [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (!bVar1) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-o    : toggles removing POs with const-0 drivers [default = %s]\n",pcVar4);
        if (fVerbose == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-v    : print verbose information [default = %s]\n",pcVar5);
        pcVar4 = "\t-h    : print the command usage\n";
LAB_001f3400:
        Abc_Print(iVar2,pcVar4);
        return 1;
      }
      fCleanupPis = fCleanupPis ^ 1;
    }
  }
  if (pAVar3 == (Abc_Ntk_t *)0x0) {
    pcVar4 = "Empty network.\n";
  }
  else {
    if (pAVar3->ntkType == ABC_NTK_STRASH) {
      if (!bVar1) {
        Abc_Print(-1,"Cleanup for PIs and POs is not enabled.\n");
        goto LAB_001f33d8;
      }
      pAVar3 = Abc_NtkDarCleanupAig(pAVar3,fCleanupPis,1,fVerbose);
    }
    else {
      Abc_NtkCleanup(pAVar3,fVerbose);
LAB_001f33d8:
      pAVar3 = Abc_NtkDup(pAVar3);
    }
    if (pAVar3 != (Abc_Ntk_t *)0x0) {
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
      return 0;
    }
    pcVar4 = "Cleanup has failed.\n";
  }
  iVar2 = -1;
  goto LAB_001f3400;
}

Assistant:

int Abc_CommandCleanup( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fCleanupPis;
    int fCleanupPos;
    int fVerbose;

    extern Abc_Ntk_t * Abc_NtkDarCleanupAig( Abc_Ntk_t * pNtk, int fCleanupPis, int fCleanupPos, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fCleanupPis = 1;
    fCleanupPos = 1;
    fVerbose    = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "iovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'i':
            fCleanupPis ^= 1;
            break;
        case 'o':
            fCleanupPos ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
    {
        if ( !fCleanupPos && !fCleanupPos )
        {
            Abc_Print( -1, "Cleanup for PIs and POs is not enabled.\n" );
            pNtkRes = Abc_NtkDup( pNtk );
        }
        else
            pNtkRes = Abc_NtkDarCleanupAig( pNtk, fCleanupPis, fCleanupPos, fVerbose );
    }
    else
    {
        Abc_NtkCleanup( pNtk, fVerbose );
        pNtkRes = Abc_NtkDup( pNtk );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Cleanup has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: cleanup [-iovh]\n" );
    Abc_Print( -2, "\t        for logic networks, removes dangling combinatinal logic\n" );
    Abc_Print( -2, "\t        for AIGs, removes PIs w/o fanout and POs driven by const-0\n" );
    Abc_Print( -2, "\t-i    : toggles removing PIs without fanout [default = %s]\n", fCleanupPis? "yes": "no" );
    Abc_Print( -2, "\t-o    : toggles removing POs with const-0 drivers [default = %s]\n", fCleanupPos? "yes": "no" );
    Abc_Print( -2, "\t-v    : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}